

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor_ict.cpp
# Opt level: O1

void __thiscall PrintICT::visit(PrintICT *this,ExpList *node)

{
  ExprNode *pEVar1;
  ExpList *pEVar2;
  
  printIR(this,"ExpList");
  this->level = this->level + 1;
  pEVar1 = node->first;
  if (pEVar1 != (ExprNode *)0x0) {
    (*(pEVar1->super_StmNode).super_ICTNode._vptr_ICTNode[2])(pEVar1,this);
  }
  pEVar2 = node->next;
  if (pEVar2 != (ExpList *)0x0) {
    (*(pEVar2->super_ExprNode).super_StmNode.super_ICTNode._vptr_ICTNode[2])(pEVar2,this);
  }
  this->level = this->level - 1;
  return;
}

Assistant:

void PrintICT::visit(ExpList *node) {
    printIR("ExpList");
    up_level();
    if (node->getFirst() != NULL) node->getFirst()->accept(this);
    if (node->getNext() != NULL) node->getNext()->accept(this);
    down_level();
}